

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::__encodeArray
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint32_t *out_00;
  pointer puVar1;
  pointer __src;
  byte bVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint uVar5;
  byte *pbVar6;
  ulong __n;
  uint32_t k;
  long lVar7;
  uint8_t bestb;
  uint8_t bestcexcept;
  uint8_t maxb;
  size_t outcap;
  byte local_6f;
  byte local_6e;
  uint8_t local_6d;
  uint local_6c;
  SimplePFor<FastPForLib::Simple8b<true>_> *local_68;
  uint32_t *local_60;
  size_t *local_58;
  uint32_t *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  size_t local_38;
  
  local_58 = nvalue;
  checkifdivisibleby(length,0x80);
  puVar1 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar1) {
    (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar4 = out + 1;
  pbVar6 = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_50 = in + length;
  this_00 = &this->datatobepacked;
  local_68 = this;
  local_60 = out;
  while (puVar3 = local_60, in + 0x80 <= local_50) {
    local_48 = in + 0x80;
    local_40 = puVar4;
    getBestBFromData(this,in,&local_6f,&local_6e,&local_6d);
    bVar2 = local_6f;
    *pbVar6 = local_6f;
    pbVar6[1] = local_6e;
    pbVar6 = pbVar6 + 2;
    if (local_6e != 0) {
      for (lVar7 = 0; this = local_68, lVar7 != 0x80; lVar7 = lVar7 + 1) {
        if (in[lVar7] >> (bVar2 & 0x1f) != 0) {
          local_6c = in[lVar7] >> (local_6f & 0x1f);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,&local_6c);
          *pbVar6 = (byte)lVar7;
          pbVar6 = pbVar6 + 1;
        }
      }
    }
    puVar4 = packblockup<128u,unsigned_int>(in,local_40,(uint)local_6f);
    in = local_48;
  }
  *local_60 = (uint32_t)((ulong)((long)puVar4 - (long)local_60) >> 2);
  __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (int)pbVar6 - (int)__src;
  *puVar4 = uVar5;
  __n = (ulong)uVar5;
  memcpy(puVar4 + 1,__src,__n);
  out_00 = (uint32_t *)((long)puVar4 + (__n + 3 & 0xfffffffffffffffc) + 4);
  for (puVar4 = (uint32_t *)((long)puVar4 + __n + 4); puVar4 < out_00;
      puVar4 = (uint32_t *)((long)puVar4 + 1)) {
    *(undefined1 *)puVar4 = 0;
  }
  local_38 = 0;
  puVar4 = (local_68->datatobepacked).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  Simple8b<true>::encodeArray
            (&local_68->ecoder,puVar4,
             (long)(local_68->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar4 >> 2,out_00,&local_38);
  *local_58 = (long)((long)out_00 + (local_38 * 4 - (long)puVar3)) >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    datatobepacked.clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        assert(bestb < 32);
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            datatobepacked.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    size_t outcap = 0;
    ecoder.encodeArray(datatobepacked.data(), datatobepacked.size(), out,
                       outcap);
    out += outcap;
    nvalue = out - initout;
  }